

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppLogger.cpp
# Opt level: O2

void __thiscall CppLogger::CppLogger::printWarn(CppLogger *this,string *t_Message)

{
  ostream *poVar1;
  string asStack_1d8 [32];
  string local_1b8 [32];
  stringstream formatted;
  
  std::__cxx11::string::string(local_1b8,t_Message);
  printFormat((CppLogger *)&formatted,(Level)this,(string *)0x3);
  std::__cxx11::string::~string(local_1b8);
  if ((int)this->m_Level < 4 && this->m_Level != None) {
    poVar1 = std::operator<<(this->m_WarnStream,(string *)&this->m_WarnColor);
    std::__cxx11::stringbuf::str();
    poVar1 = std::operator<<(poVar1,asStack_1d8);
    poVar1 = std::operator<<(poVar1,(string *)Color::reset_abi_cxx11_);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string(asStack_1d8);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&formatted);
  return;
}

Assistant:

void CppLogger::printWarn(std::string t_Message) {
        std::stringstream formatted = printFormat(Level::Warn, t_Message);
        if (m_Level != Level::None && m_Level <= Level::Warn)
            *m_WarnStream << m_WarnColor << formatted.str() << Color::reset << std::endl;
    }